

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_api.cpp
# Opt level: O0

void parallel_query_with_new_connection(DuckDB *db,bool *correct,size_t threadnr)

{
  byte bVar1;
  long in_RDX;
  long in_RSI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  templated_unique_single_t conn;
  size_t i;
  allocator_type *in_stack_fffffffffffffdc8;
  vector<duckdb::Value,_true> *in_stack_fffffffffffffdd0;
  initializer_list<duckdb::Value> in_stack_fffffffffffffdd8;
  DuckDB *in_stack_fffffffffffffde8;
  Value *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *result_00;
  undefined8 local_1b2;
  Value *local_198;
  Value local_190 [64];
  Value local_150 [64];
  Value local_110 [64];
  Value local_d0 [64];
  Value *local_90;
  undefined8 local_88;
  allocator local_61;
  string local_60 [48];
  string local_30 [16];
  ulong local_20;
  long local_18;
  long local_10;
  
  *(undefined1 *)(in_RSI + in_RDX) = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < 100; local_20 = local_20 + 1) {
    duckdb::make_uniq<duckdb::Connection,duckdb::DuckDB&>(in_stack_fffffffffffffde8);
    duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
    operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               in_stack_fffffffffffffdd0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"SELECT * FROM integers ORDER BY i",&local_61);
    duckdb::Connection::Query(local_30);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_1b2._1_1_ = 1;
    local_198 = local_190;
    duckdb::Value::Value(local_198,1);
    local_198 = local_150;
    duckdb::Value::Value(local_198,2);
    local_198 = local_110;
    duckdb::Value::Value(local_198,3);
    local_198 = local_d0;
    duckdb::LogicalType::LogicalType((LogicalType *)((long)&local_1b2 + 2),SQLNULL);
    duckdb::Value::Value(local_d0,(long)&local_1b2 + 2);
    local_1b2._1_1_ = 0;
    local_90 = local_190;
    local_88 = 4;
    result_00 = (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)&local_1b2;
    std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x53266b);
    duckdb::vector<duckdb::Value,_true>::vector
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffe1f =
         duckdb::CHECK_COLUMN
                   (result_00,CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                    (vector<duckdb::Value,_true> *)in_stack_fffffffffffffe10);
    bVar1 = in_stack_fffffffffffffe1f ^ 0xff;
    duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x5326c5);
    std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x5326d2);
    in_stack_fffffffffffffe10 = (Value *)&local_90;
    do {
      in_stack_fffffffffffffe10 = in_stack_fffffffffffffe10 + -0x40;
      duckdb::Value::~Value(in_stack_fffffffffffffe10);
    } while (in_stack_fffffffffffffe10 != local_190);
    duckdb::LogicalType::~LogicalType((LogicalType *)((long)&local_1b2 + 2));
    if ((bVar1 & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x5328d8);
    duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
    ~unique_ptr((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
                0x5328e5);
  }
  return;
}

Assistant:

static void parallel_query_with_new_connection(DuckDB *db, bool *correct, size_t threadnr) {
	correct[threadnr] = true;
	for (size_t i = 0; i < 100; i++) {
		auto conn = make_uniq<Connection>(*db);
		auto result = conn->Query("SELECT * FROM integers ORDER BY i");
		if (!CHECK_COLUMN(result, 0, {1, 2, 3, Value()})) {
			correct[threadnr] = false;
		}
	}
}